

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2polygon.cc
# Opt level: O2

bool __thiscall S2Polygon::FindValidationError(S2Polygon *this,S2Error *error)

{
  byte bVar1;
  int iVar2;
  __uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_> _Var3;
  bool bVar4;
  pointer puVar5;
  char *format;
  Code CVar6;
  ulong uVar7;
  undefined8 local_40 [4];
  
  puVar5 = (this->loops_).
           super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar7 = 0;
  while( true ) {
    if ((long)(int)((ulong)((long)(this->loops_).
                                  super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5) >> 3)
        <= (long)uVar7) {
      bVar4 = s2shapeutil::FindSelfIntersection(&(this->index_).super_S2ShapeIndex,error);
      if (!bVar4) {
        if (this->error_inconsistent_loop_orientations_ == '\0') {
          bVar4 = FindLoopNestingError(this,error);
          return bVar4;
        }
        S2Error::Init(error,POLYGON_INCONSISTENT_LOOP_ORIENTATIONS,
                      "Inconsistent loop orientations detected");
      }
      return true;
    }
    bVar4 = S2Loop::FindValidationErrorNoIndex
                      ((S2Loop *)
                       puVar5[uVar7]._M_t.
                       super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t,error);
    if (bVar4) {
      CVar6 = error->code_;
      std::__cxx11::string::string((string *)local_40,(string *)&error->text_);
      S2Error::Init(error,CVar6,"Loop %d: %s",uVar7 & 0xffffffff,local_40[0]);
      std::__cxx11::string::~string((string *)local_40);
      return true;
    }
    puVar5 = (this->loops_).
             super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var3._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
    super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl =
         puVar5[uVar7]._M_t.super___uniq_ptr_impl<S2Loop,_std::default_delete<S2Loop>_>._M_t;
    iVar2 = *(int *)((long)_Var3._M_t.super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>
                           .super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0xc);
    bVar1 = *(byte *)((long)_Var3._M_t.
                            super__Tuple_impl<0UL,_S2Loop_*,_std::default_delete<S2Loop>_>.
                            super__Head_base<0UL,_S2Loop_*,_false>._M_head_impl + 0x1a);
    if (iVar2 == 1 && (bVar1 & 1) == 0) break;
    if (((iVar2 == 1 & bVar1) == 1) &&
       (1 < (int)((ulong)((long)(this->loops_).
                                super__Vector_base<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>,_std::allocator<std::unique_ptr<S2Loop,_std::default_delete<S2Loop>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)puVar5) >> 3))) {
      format = "Loop %d: full loop appears in non-full polygon";
      CVar6 = POLYGON_EXCESS_FULL_LOOP;
      goto LAB_002446d6;
    }
    uVar7 = uVar7 + 1;
  }
  format = "Loop %d: empty loops are not allowed";
  CVar6 = POLYGON_EMPTY_LOOP;
LAB_002446d6:
  S2Error::Init(error,CVar6,format,uVar7 & 0xffffffff);
  return true;
}

Assistant:

bool S2Polygon::FindValidationError(S2Error* error) const {
  for (int i = 0; i < num_loops(); ++i) {
    // Check for loop errors that don't require building an S2ShapeIndex.
    if (loop(i)->FindValidationErrorNoIndex(error)) {
      error->Init(error->code(),
                  "Loop %d: %s", i, error->text().c_str());
      return true;
    }
    // Check that no loop is empty, and that the full loop only appears in the
    // full polygon.
    if (loop(i)->is_empty()) {
      error->Init(S2Error::POLYGON_EMPTY_LOOP,
                  "Loop %d: empty loops are not allowed", i);
      return true;
    }
    if (loop(i)->is_full() && num_loops() > 1) {
      error->Init(S2Error::POLYGON_EXCESS_FULL_LOOP,
                  "Loop %d: full loop appears in non-full polygon", i);
      return true;
    }
  }

  // Check for loop self-intersections and loop pairs that cross
  // (including duplicate edges and vertices).
  if (s2shapeutil::FindSelfIntersection(index_, error)) return true;

  // Check whether InitOriented detected inconsistent loop orientations.
  if (error_inconsistent_loop_orientations_) {
    error->Init(S2Error::POLYGON_INCONSISTENT_LOOP_ORIENTATIONS,
                "Inconsistent loop orientations detected");
    return true;
  }

  // Finally, verify the loop nesting hierarchy.
  return FindLoopNestingError(error);
}